

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

int Gia_ManSimWriteFile(char *pFileOut,Vec_Int_t *vPat,int nOuts)

{
  int iVar1;
  FILE *__stream;
  int i;
  
  __stream = fopen(pFileOut,"wb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open output file.");
    iVar1 = 0;
  }
  else {
    iVar1 = vPat->nSize;
    if (iVar1 % nOuts != 0) {
      __assert_fail("Vec_IntSize(vPat) % nOuts == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                    ,0x2b5,"int Gia_ManSimWriteFile(char *, Vec_Int_t *, int)");
    }
    for (i = 0; i < iVar1; i = i + 1) {
      iVar1 = Vec_IntEntry(vPat,i);
      fputc(iVar1 + 0x30,__stream);
      if (i % nOuts == nOuts + -1) {
        fputc(10,__stream);
      }
      iVar1 = vPat->nSize;
    }
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Gia_ManSimWriteFile( char * pFileOut, Vec_Int_t * vPat, int nOuts )
{
    int c, i;
    FILE * pFile = fopen( pFileOut, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return 0;
    }
    assert( Vec_IntSize(vPat) % nOuts == 0 );
    Vec_IntForEachEntry( vPat, c, i )
    {
        fputc( '0' + c, pFile );
        if ( i % nOuts == nOuts - 1 )
            fputc( '\n', pFile );
    }
    fclose( pFile );
    return 1;
}